

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O0

idx_t __thiscall duckdb::HashJoinGlobalSourceState::MaxThreads(HashJoinGlobalSourceState *this)

{
  bool bVar1;
  ulong uVar2;
  long in_RDI;
  idx_t count;
  HashJoinGlobalSinkState *gstate;
  GlobalSinkState *in_stack_ffffffffffffffe0;
  
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
  operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              *)in_stack_ffffffffffffffe0);
  GlobalSinkState::Cast<duckdb::HashJoinGlobalSinkState>(in_stack_ffffffffffffffe0);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
                      *)0x1823a9d);
  if (bVar1) {
    uVar2 = *(ulong *)(in_RDI + 0x90);
  }
  else {
    bVar1 = PropagatesBuildSide(*(JoinType *)(*(long *)(in_RDI + 0x50) + 0x81));
    if (!bVar1) {
      return 0;
    }
    unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::operator->
              ((unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                *)in_stack_ffffffffffffffe0);
    uVar2 = JoinHashTable::Count((JoinHashTable *)0x1823ae5);
  }
  return uVar2 / (ulong)(*(long *)(in_RDI + 0x98) << 0xb);
}

Assistant:

idx_t MaxThreads() override {
		D_ASSERT(op.sink_state);
		auto &gstate = op.sink_state->Cast<HashJoinGlobalSinkState>();

		idx_t count;
		if (gstate.probe_spill) {
			count = probe_count;
		} else if (PropagatesBuildSide(op.join_type)) {
			count = gstate.hash_table->Count();
		} else {
			return 0;
		}
		return count / ((idx_t)STANDARD_VECTOR_SIZE * parallel_scan_chunk_count);
	}